

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int mbedtls_ssl_read(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  uchar *__src;
  char *pcVar4;
  ulong __n;
  
  __n = 0xffff8f00;
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x162c,"=> read");
    if ((ssl->conf->transport == '\x01') &&
       ((uVar2 = mbedtls_ssl_flush_output(ssl), uVar2 != 0 ||
        (((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0 &&
          (ssl->handshake->retransmit_state == '\x01')) &&
         (uVar2 = mbedtls_ssl_flight_transmit(ssl), uVar2 != 0)))))) {
      __n = (ulong)uVar2;
    }
    else if (((ssl->state == 0x1b) || (uVar2 = mbedtls_ssl_handshake(ssl), uVar2 == 0xffff9500)) ||
            (__n = (ulong)uVar2, uVar2 == 0)) {
      __src = ssl->in_offt;
      if (__src == (uchar *)0x0) {
        __n = 0;
        do {
          if ((ssl->f_get_timer != (mbedtls_ssl_get_timer_t *)0x0) &&
             (iVar3 = (*ssl->f_get_timer)(ssl->p_timer), iVar3 == -1)) {
            mbedtls_ssl_set_timer(ssl,ssl->conf->read_timeout);
          }
          uVar2 = mbedtls_ssl_read_record(ssl,1);
          if (uVar2 != 0) {
            if (uVar2 != 0xffff8d80) {
              pcVar4 = "mbedtls_ssl_read_record";
              iVar3 = 0x1668;
LAB_001a51a2:
              mbedtls_debug_print_ret
                        (ssl,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,iVar3,pcVar4,uVar2);
              __n = (ulong)uVar2;
            }
            goto LAB_001a51ad;
          }
          if (((ssl->in_msglen == 0) && (ssl->in_msgtype == 0x17)) &&
             (uVar2 = mbedtls_ssl_read_record(ssl,1), uVar2 != 0)) {
            __n = 0;
            if (uVar2 != 0xffff8d80) {
              pcVar4 = "mbedtls_ssl_read_record";
              iVar3 = 0x1676;
              goto LAB_001a51a2;
            }
            goto LAB_001a51ad;
          }
          iVar3 = ssl->in_msgtype;
          if (iVar3 == 0x16) {
            uVar2 = 0xffff9400;
            if (ssl->tls_version < MBEDTLS_SSL_VERSION_TLS1_3) {
              uVar1 = ssl->conf->endpoint;
              if (uVar1 == '\x01') {
                if (*ssl->in_msg != '\x01') {
                  iVar3 = 0x15d4;
                  pcVar4 = "handshake received (not ClientHello)";
                  goto LAB_001a5046;
                }
              }
              else if ((uVar1 == '\0') &&
                      ((*ssl->in_msg != '\0' ||
                       (ssl->in_hslen != (ulong)(ssl->conf->transport == '\x01') * 8 + 4)))) {
                iVar3 = 0x15c5;
                pcVar4 = "handshake received (not HelloRequest)";
LAB_001a5046:
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,iVar3,pcVar4);
                uVar2 = 0xffff8900;
                if (ssl->conf->transport == '\x01') {
                  uVar2 = 0;
                }
                goto LAB_001a505e;
              }
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                         ,0x15ff,"refusing renegotiation, sending alert");
              uVar2 = mbedtls_ssl_send_alert_message(ssl,'\x01','d');
            }
LAB_001a505e:
            if (uVar2 != 0) {
              pcVar4 = "ssl_handle_hs_message_post_handshake";
              iVar3 = 0x167f;
              goto LAB_001a51a2;
            }
          }
          else {
            if (iVar3 != 0x17) {
              if (iVar3 == 0x15) {
                mbedtls_debug_print_msg
                          (ssl,2,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x16a8,"ignoring non-fatal non-closure alert");
                __n = 0xffff9700;
              }
              else {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                           ,0x16ad,"bad application data message");
                __n = 0xffff8900;
              }
              goto LAB_001a51ad;
            }
            ssl->in_offt = ssl->in_msg;
            if (0x1a < ssl->state) {
              mbedtls_ssl_set_timer(ssl,0);
            }
          }
          __src = ssl->in_offt;
        } while (__src == (uchar *)0x0);
      }
      __n = ssl->in_msglen;
      if (len <= ssl->in_msglen) {
        __n = len;
      }
      if (len != 0) {
        memcpy(buf,__src,__n);
        ssl->in_msglen = ssl->in_msglen - __n;
      }
      mbedtls_platform_zeroize(ssl->in_offt,__n);
      if (ssl->in_msglen == 0) {
        ssl->in_offt = (uchar *)0x0;
        ssl->keep_current_message = 0;
      }
      else {
        ssl->in_offt = ssl->in_offt + __n;
      }
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x16df,"<= read");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                 ,0x1656,"mbedtls_ssl_handshake",uVar2);
    }
  }
LAB_001a51ad:
  return (int)__n;
}

Assistant:

int mbedtls_ssl_read(mbedtls_ssl_context *ssl, unsigned char *buf, size_t len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;

    if (ssl == NULL || ssl->conf == NULL) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> read"));

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        if ((ret = mbedtls_ssl_flush_output(ssl)) != 0) {
            return ret;
        }

        if (ssl->handshake != NULL &&
            ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING) {
            if ((ret = mbedtls_ssl_flight_transmit(ssl)) != 0) {
                return ret;
            }
        }
    }
#endif

    /*
     * Check if renegotiation is necessary and/or handshake is
     * in process. If yes, perform/continue, and fall through
     * if an unexpected packet is received while the client
     * is waiting for the ServerHello.
     *
     * (There is no equivalent to the last condition on
     *  the server-side as it is not treated as within
     *  a handshake while waiting for the ClientHello
     *  after a renegotiation request.)
     */

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ret = ssl_check_ctr_renegotiate(ssl);
    if (ret != MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO &&
        ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "ssl_check_ctr_renegotiate", ret);
        return ret;
    }
#endif

    if (ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER) {
        ret = mbedtls_ssl_handshake(ssl);
        if (ret != MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO &&
            ret != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_handshake", ret);
            return ret;
        }
    }

    /* Loop as long as no application data record is available */
    while (ssl->in_offt == NULL) {
        /* Start timer if not already running */
        if (ssl->f_get_timer != NULL &&
            ssl->f_get_timer(ssl->p_timer) == -1) {
            mbedtls_ssl_set_timer(ssl, ssl->conf->read_timeout);
        }

        if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
            if (ret == MBEDTLS_ERR_SSL_CONN_EOF) {
                return 0;
            }

            MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
            return ret;
        }

        if (ssl->in_msglen  == 0 &&
            ssl->in_msgtype == MBEDTLS_SSL_MSG_APPLICATION_DATA) {
            /*
             * OpenSSL sends empty messages to randomize the IV
             */
            if ((ret = mbedtls_ssl_read_record(ssl, 1)) != 0) {
                if (ret == MBEDTLS_ERR_SSL_CONN_EOF) {
                    return 0;
                }

                MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_read_record", ret);
                return ret;
            }
        }

        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE) {
            ret = ssl_handle_hs_message_post_handshake(ssl);
            if (ret != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "ssl_handle_hs_message_post_handshake",
                                      ret);
                return ret;
            }

            /* At this point, we don't know whether the renegotiation triggered
             * by the post-handshake message has been completed or not. The cases
             * to consider are the following:
             * 1) The renegotiation is complete. In this case, no new record
             *    has been read yet.
             * 2) The renegotiation is incomplete because the client received
             *    an application data record while awaiting the ServerHello.
             * 3) The renegotiation is incomplete because the client received
             *    a non-handshake, non-application data message while awaiting
             *    the ServerHello.
             *
             * In each of these cases, looping will be the proper action:
             * - For 1), the next iteration will read a new record and check
             *   if it's application data.
             * - For 2), the loop condition isn't satisfied as application data
             *   is present, hence continue is the same as break
             * - For 3), the loop condition is satisfied and read_record
             *   will re-deliver the message that was held back by the client
             *   when expecting the ServerHello.
             */

            continue;
        }
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        else if (ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING) {
            if (ssl->conf->renego_max_records >= 0) {
                if (++ssl->renego_records_seen > ssl->conf->renego_max_records) {
                    MBEDTLS_SSL_DEBUG_MSG(1, ("renegotiation requested, "
                                              "but not honored by client"));
                    return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
                }
            }
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        /* Fatal and closure alerts handled by mbedtls_ssl_read_record() */
        if (ssl->in_msgtype == MBEDTLS_SSL_MSG_ALERT) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("ignoring non-fatal non-closure alert"));
            return MBEDTLS_ERR_SSL_WANT_READ;
        }

        if (ssl->in_msgtype != MBEDTLS_SSL_MSG_APPLICATION_DATA) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("bad application data message"));
            return MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE;
        }

        ssl->in_offt = ssl->in_msg;

        /* We're going to return something now, cancel timer,
         * except if handshake (renegotiation) is in progress */
        if (mbedtls_ssl_is_handshake_over(ssl) == 1) {
            mbedtls_ssl_set_timer(ssl, 0);
        }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        /* If we requested renego but received AppData, resend HelloRequest.
         * Do it now, after setting in_offt, to avoid taking this branch
         * again if ssl_write_hello_request() returns WANT_WRITE */
#if defined(MBEDTLS_SSL_SRV_C) && defined(MBEDTLS_SSL_RENEGOTIATION)
        if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER &&
            ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING) {
            if ((ret = mbedtls_ssl_resend_hello_request(ssl)) != 0) {
                MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_resend_hello_request",
                                      ret);
                return ret;
            }
        }
#endif /* MBEDTLS_SSL_SRV_C && MBEDTLS_SSL_RENEGOTIATION */
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    }

    n = (len < ssl->in_msglen)
        ? len : ssl->in_msglen;

    if (len != 0) {
        memcpy(buf, ssl->in_offt, n);
        ssl->in_msglen -= n;
    }

    /* Zeroising the plaintext buffer to erase unused application data
       from the memory. */
    mbedtls_platform_zeroize(ssl->in_offt, n);

    if (ssl->in_msglen == 0) {
        /* all bytes consumed */
        ssl->in_offt = NULL;
        ssl->keep_current_message = 0;
    } else {
        /* more data available */
        ssl->in_offt += n;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= read"));

    return (int) n;
}